

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O1

int fits_rcomp_byte(char *a,int nx,uchar *c,int clen,int nblock)

{
  bool bVar1;
  uint uVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uchar *__s;
  int iVar11;
  char cVar12;
  char cVar13;
  Buffer_t *pBVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Buffer bufmem;
  Buffer local_a0;
  uint local_80;
  uint local_7c;
  long local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  void *local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  local_a0.end = c + clen;
  local_a0.bits_to_go = 8;
  local_78 = (long)nblock;
  local_a0.start = c;
  local_a0.current = c;
  __ptr = malloc(local_78 * 4);
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
LAB_001bb844:
    local_a0.current._0_4_ = -1;
  }
  else {
    local_a0.bitbuffer = 0;
    local_a0.bits_to_go = 8;
    output_nbits(&local_a0,(int)*a,8);
    if (0 < nx) {
      cVar12 = *a;
      lVar9 = 0;
      local_68 = (ulong)(uint)nblock;
      local_58 = (ulong)(uint)nx;
      local_50 = __ptr;
      do {
        uVar4 = local_58 - lVar9;
        if (local_78 <= (long)(local_58 - lVar9)) {
          uVar4 = local_68;
        }
        uVar8 = uVar4 & 0xffffffff;
        iVar6 = (int)uVar4;
        if (iVar6 < 1) {
          dVar15 = 0.0;
        }
        else {
          dVar15 = 0.0;
          uVar3 = 0;
          cVar13 = cVar12;
          do {
            cVar12 = a[uVar3];
            uVar5 = (int)((char)(cVar12 - cVar13) >> 7) ^ (char)(cVar12 - cVar13) * 2;
            *(uint *)((long)__ptr + uVar3 * 4) = uVar5;
            dVar15 = dVar15 + (double)(int)uVar5;
            uVar3 = uVar3 + 1;
            cVar13 = cVar12;
          } while ((uVar4 & 0xffffffff) != uVar3);
        }
        dVar17 = ((dVar15 - (double)((int)(((uint)(uVar4 >> 0x1f) & 1) + iVar6) >> 1)) + -1.0) /
                 (double)iVar6;
        dVar16 = 0.0;
        if (0.0 <= dVar17) {
          dVar16 = dVar17;
        }
        uVar4 = 0;
        if (1 < (byte)(int)dVar16) {
          uVar2 = (int)dVar16 & 0xff;
          uVar5 = 0x1f;
          if (uVar2 != 0) {
            for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar4 = (ulong)(uVar5 & 0xff);
        }
        uVar5 = (uint)uVar4;
        local_68 = uVar8;
        local_40 = a;
        if (uVar5 < 6) {
          if (((uVar5 != 0) || (dVar15 != 0.0)) || (NAN(dVar15))) {
            local_70 = uVar4;
            local_60 = lVar9;
            output_nbits(&local_a0,uVar5 + 1,3);
            pBVar14 = local_a0.current;
            uVar5 = local_a0.bitbuffer;
            iVar7 = local_a0.bits_to_go;
            if (0 < iVar6) {
              uVar2 = ~(-1 << ((byte)local_70 & 0x1f));
              uVar3 = 0;
              uVar4 = local_70;
              local_80 = uVar2;
              local_48 = uVar8;
              do {
                uVar10 = *(uint *)((long)__ptr + uVar3 * 4);
                iVar11 = (int)uVar10 >> ((byte)uVar4 & 0x1f);
                iVar6 = iVar11 - iVar7;
                if (iVar11 < iVar7) {
                  uVar5 = uVar5 << ((byte)(iVar11 + 1) & 0x1f) | 1;
                  iVar6 = iVar7 - (iVar11 + 1);
                }
                else {
                  __s = pBVar14 + 1;
                  *pBVar14 = (uchar)(uVar5 << ((byte)iVar7 & 0x1f));
                  if (7 < iVar6) {
                    if (0xe < iVar6) {
                      iVar6 = 0xf;
                    }
                    uVar2 = (iVar11 - (iVar6 + iVar7)) + 7;
                    uVar5 = uVar2 >> 3;
                    local_38 = (ulong)uVar5;
                    local_7c = uVar10;
                    memset(__s,0,(ulong)(uVar5 + 1));
                    __s = pBVar14 + local_38 + 2;
                    iVar6 = (iVar11 - ((uVar2 & 0xfffffff8) + iVar7)) + -8;
                    uVar4 = local_70;
                    uVar8 = local_48;
                    __ptr = local_50;
                    uVar2 = local_80;
                    uVar10 = local_7c;
                  }
                  iVar6 = 7 - iVar6;
                  uVar5 = 1;
                  pBVar14 = __s;
                }
                iVar11 = (int)uVar4;
                iVar7 = iVar6;
                if (iVar11 != 0) {
                  uVar5 = uVar10 & uVar2 | uVar5 << ((byte)uVar4 & 0x1f);
                  iVar7 = iVar6 - iVar11;
                  if (iVar7 == 0 || iVar6 < iVar11) {
                    iVar11 = iVar11 - iVar6;
                    iVar6 = iVar7;
                    do {
                      *pBVar14 = (uchar)((int)uVar5 >> ((byte)iVar11 & 0x1f));
                      pBVar14 = pBVar14 + 1;
                      iVar7 = iVar6 + 8;
                      iVar11 = iVar11 + -8;
                      bVar1 = iVar6 < -7;
                      iVar6 = iVar7;
                    } while (bVar1);
                  }
                }
                uVar3 = uVar3 + 1;
              } while (uVar3 != uVar8);
            }
            local_a0.current = pBVar14;
            if (local_a0.end < pBVar14) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              goto LAB_001bb844;
            }
            local_a0.bits_to_go = iVar7;
            local_a0.bitbuffer = uVar5;
            lVar9 = local_60;
          }
          else {
            output_nbits(&local_a0,0,3);
          }
        }
        else {
          output_nbits(&local_a0,7,3);
          if (0 < iVar6) {
            uVar4 = local_68 & 0xffffffff;
            uVar8 = 0;
            do {
              output_nbits(&local_a0,*(int *)((long)__ptr + uVar8 * 4),8);
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
        }
        lVar9 = lVar9 + local_78;
        a = local_40 + local_78;
      } while (lVar9 < (long)local_58);
    }
    if (local_a0.bits_to_go < 8) {
      *local_a0.current = (uchar)(local_a0.bitbuffer << ((byte)local_a0.bits_to_go & 0x1f));
      local_a0.current = local_a0.current + 1;
    }
    free(__ptr);
    local_a0.current._0_4_ = (int)local_a0.current - (int)local_a0.start;
  }
  return (int)local_a0.current;
}

Assistant:

int fits_rcomp_byte(
	  signed char a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize; */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
signed char pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned char psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 1;  */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 3;
    fsmax = 6;
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first byte value to the first  byte of the buffer */
    if (output_nbits(buffer, a[0], 8) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned char) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}